

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helpers_for_testing.hpp
# Opt level: O3

void HelpersForTests::noise_bitstring_inplace<bool,6144ul>
               (array<bool,_6144UL> *src,double err_prob,uint seed)

{
  long lVar1;
  ulong uVar2;
  size_t i;
  double dVar3;
  mt19937_64 rng;
  mersenne_twister_engine<unsigned_long,_64UL,_312UL,_156UL,_31UL,_13043109905998158313UL,_29UL,_6148914691236517205UL,_17UL,_8202884508482404352UL,_37UL,_18444473444759240704UL,_43UL,_6364136223846793005UL>
  local_9e0;
  
  local_9e0._M_x[0] = (unsigned_long)seed;
  lVar1 = 1;
  uVar2 = local_9e0._M_x[0];
  do {
    uVar2 = (uVar2 >> 0x3e ^ uVar2) * 0x5851f42d4c957f2d + lVar1;
    local_9e0._M_x[lVar1] = uVar2;
    lVar1 = lVar1 + 1;
  } while (lVar1 != 0x138);
  local_9e0._M_p = 0x138;
  lVar1 = 0;
  do {
    dVar3 = std::
            generate_canonical<double,53ul,std::mersenne_twister_engine<unsigned_long,64ul,312ul,156ul,31ul,13043109905998158313ul,29ul,6148914691236517205ul,17ul,8202884508482404352ul,37ul,18444473444759240704ul,43ul,6364136223846793005ul>>
                      (&local_9e0);
    if (dVar3 < err_prob) {
      src->_M_elems[lVar1] = (bool)(src->_M_elems[lVar1] ^ 1);
    }
    lVar1 = lVar1 + 1;
  } while (lVar1 != 0x1800);
  return;
}

Assistant:

void noise_bitstring_inplace(std::array<T, N> &src, double err_prob, unsigned int seed = 0) {
        std::mt19937_64 rng{seed}; // hard-coded seed for testing purposes.

        std::bernoulli_distribution distribution(err_prob);

        for (std::size_t i = 0; i < src.size(); i++) {
            if (distribution(rng)) {
                src[i] = !src[i];
            } else {
                src[i] = src[i];
            }
        }
    }